

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_cache.cc
# Opt level: O0

Status __thiscall
leveldb::TableCache::Get
          (TableCache *this,ReadOptions *options,uint64_t file_number,uint64_t file_size,Slice *k,
          void *arg,_func_void_void_ptr_Slice_ptr_Slice_ptr *handle_result)

{
  long lVar1;
  bool bVar2;
  Handle **in_RDX;
  uint64_t in_RSI;
  char *in_RDI;
  long in_FS_OFFSET;
  Table *t;
  _func_void_void_ptr_Slice_ptr_Slice_ptr *in_stack_00000058;
  Status *s;
  Handle *handle;
  Status *in_stack_ffffffffffffff58;
  Status *in_stack_ffffffffffffff60;
  Status in_stack_ffffffffffffffe8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  FindTable((TableCache *)in_stack_ffffffffffffffe8.state_,(uint64_t)in_RDI,in_RSI,in_RDX);
  bVar2 = Status::ok(in_stack_ffffffffffffff58);
  if (bVar2) {
    (**(code **)(**(long **)(in_RSI + 0x30) + 0x28))(*(long **)(in_RSI + 0x30),0);
    Table::InternalGet((Table *)options,(ReadOptions *)file_number,(Slice *)file_size,k,
                       in_stack_00000058);
    Status::operator=((Status *)&stack0xffffffffffffffe8,in_stack_ffffffffffffff60);
    Status::~Status(in_stack_ffffffffffffff58);
    (**(code **)(**(long **)(in_RSI + 0x30) + 0x20))(*(long **)(in_RSI + 0x30),0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (Status)in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

Status TableCache::Get(const ReadOptions& options, uint64_t file_number,
                       uint64_t file_size, const Slice& k, void* arg,
                       void (*handle_result)(void*, const Slice&,
                                             const Slice&)) {
  Cache::Handle* handle = nullptr;
  Status s = FindTable(file_number, file_size, &handle);
  if (s.ok()) {
    Table* t = reinterpret_cast<TableAndFile*>(cache_->Value(handle))->table;
    s = t->InternalGet(options, k, arg, handle_result);
    cache_->Release(handle);
  }
  return s;
}